

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  string local_c8;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_a8;
  Resources res;
  Environment env;
  
  Environment::Environment(&env,context,1);
  PipelineLayout::Resources::Resources(&res,&env,params);
  PipelineLayout::create((Move<vk::Handle<(vk::HandleType)16>_> *)&local_a8,&env,&res,params);
  local_c8.field_2._M_allocated_capacity = (size_type)local_a8.m_data.deleter.m_device;
  local_c8.field_2._8_8_ = local_a8.m_data.deleter.m_allocator;
  local_c8._M_dataplus._M_p = (pointer)local_a8.m_data.object.m_internal;
  local_c8._M_string_length = (size_type)local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Ok",(allocator<char> *)&local_a8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  PipelineLayout::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}